

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.hpp
# Opt level: O2

uint8_t __thiscall duckdb::BitReader::InnerReadByte(BitReader *this,uint8_t *offset)

{
  uint uVar1;
  
  uVar1 = this->index;
  return (uint8_t)(((uint)CONCAT11(this->input[(ulong)*offset + (ulong)(uVar1 >> 3)],
                                   REMAINDER_MASKS[(ulong)(uVar1 & 7) + 8] &
                                   this->input[(ulong)*offset + 1 + (ulong)(uVar1 >> 3)]) <<
                   ((byte)uVar1 & 7)) >> 8);
}

Assistant:

inline uint8_t InnerReadByte(const uint8_t &offset) {
		uint8_t result = static_cast<uint8_t>(input[ByteIndex() + offset] << BitIndex()) |
		                 ((input[ByteIndex() + offset + 1] & REMAINDER_MASKS[8 + BitIndex()]) >> (8 - BitIndex()));
		return result;
	}